

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

bool ON_wString::IsXMLSpecialCharacter(wchar_t c)

{
  return (bool)((byte)(0x500000c400000000 >> ((byte)c & 0x3f)) & (uint)c < 0x3f);
}

Assistant:

bool ON_wString::IsXMLSpecialCharacter(wchar_t c)
{
  switch (c)
  {
  case ON_UnicodeCodePoint::ON_QuotationMark:
  case ON_UnicodeCodePoint::ON_Ampersand:
  case ON_UnicodeCodePoint::ON_Apostrophe:
  case ON_UnicodeCodePoint::ON_LessThanSign:
  case ON_UnicodeCodePoint::ON_GreaterThanSign:
    return true;
    break;
  }

  return false;
}